

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

int secp256k1_ecmult_wnaf(int *wnaf,int len,secp256k1_scalar *a,int w)

{
  uint32_t uVar1;
  uint in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  void *in_RDI;
  int word;
  int now;
  int carry;
  int sign;
  int bit;
  int last_set_bit;
  secp256k1_scalar s;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  secp256k1_scalar *r;
  
  iVar6 = -1;
  iVar4 = 0;
  iVar3 = 1;
  uVar2 = 0;
  memset(in_RDI,0,(long)in_ESI << 2);
  r = (secp256k1_scalar *)*in_RDX;
  uVar1 = secp256k1_scalar_get_bits_limb32
                    ((secp256k1_scalar *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa8);
  if (uVar1 != 0) {
    secp256k1_scalar_negate(r,(secp256k1_scalar *)CONCAT44(iVar6,iVar4));
    iVar3 = -1;
  }
  while (iVar5 = iVar4, iVar5 < in_ESI) {
    uVar1 = secp256k1_scalar_get_bits_limb32
                      ((secp256k1_scalar *)CONCAT44(iVar3,uVar2),in_stack_ffffffffffffffac,
                       in_stack_ffffffffffffffa8);
    if (uVar1 == uVar2) {
      iVar4 = iVar5 + 1;
    }
    else {
      in_stack_ffffffffffffffac = in_ECX;
      if (in_ESI - iVar5 < (int)in_ECX) {
        in_stack_ffffffffffffffac = in_ESI - iVar5;
      }
      uVar1 = secp256k1_scalar_get_bits_var
                        ((secp256k1_scalar *)
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0,0x1545d7d);
      iVar4 = uVar1 + uVar2;
      uVar2 = iVar4 >> ((byte)in_ECX - 1 & 0x1f) & 1;
      in_stack_ffffffffffffffa8 = iVar4 - (uVar2 << ((byte)in_ECX & 0x1f));
      *(uint *)((long)in_RDI + (long)iVar5 * 4) = iVar3 * in_stack_ffffffffffffffa8;
      iVar4 = in_stack_ffffffffffffffac + iVar5;
      iVar6 = iVar5;
    }
  }
  return iVar6 + 1;
}

Assistant:

static int secp256k1_ecmult_wnaf(int *wnaf, int len, const secp256k1_scalar *a, int w) {
    secp256k1_scalar s;
    int last_set_bit = -1;
    int bit = 0;
    int sign = 1;
    int carry = 0;

    VERIFY_CHECK(wnaf != NULL);
    VERIFY_CHECK(0 <= len && len <= 256);
    VERIFY_CHECK(a != NULL);
    VERIFY_CHECK(2 <= w && w <= 31);

    memset(wnaf, 0, len * sizeof(wnaf[0]));

    s = *a;
    if (secp256k1_scalar_get_bits_limb32(&s, 255, 1)) {
        secp256k1_scalar_negate(&s, &s);
        sign = -1;
    }

    while (bit < len) {
        int now;
        int word;
        if (secp256k1_scalar_get_bits_limb32(&s, bit, 1) == (unsigned int)carry) {
            bit++;
            continue;
        }

        now = w;
        if (now > len - bit) {
            now = len - bit;
        }

        word = secp256k1_scalar_get_bits_var(&s, bit, now) + carry;

        carry = (word >> (w-1)) & 1;
        word -= carry << w;

        wnaf[bit] = sign * word;
        last_set_bit = bit;

        bit += now;
    }
#ifdef VERIFY
    {
        int verify_bit = bit;

        VERIFY_CHECK(carry == 0);

        while (verify_bit < 256) {
            VERIFY_CHECK(secp256k1_scalar_get_bits_limb32(&s, verify_bit, 1) == 0);
            verify_bit++;
        }
    }
#endif
    return last_set_bit + 1;
}